

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

_Bool clone_data(void **dst,void *src,size_t len)

{
  void *__dest;
  _Bool _Var1;
  
  if (len == 0) {
    *dst = (void *)0x0;
    _Var1 = true;
  }
  else {
    __dest = wally_malloc(len);
    *dst = __dest;
    if (__dest != (void *)0x0) {
      memcpy(__dest,src,len);
    }
    _Var1 = *dst != (void *)0x0;
  }
  return _Var1;
}

Assistant:

bool clone_data(void **dst, const void *src, size_t len)
{
    if (!len) {
        *dst = NULL;
        return true;
    }
    *dst = wally_malloc(len);
    if (*dst)
        memcpy(*dst, src, len);
    return *dst != NULL;
}